

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_font * nk_font_atlas_add_from_file
                    (nk_font_atlas *atlas,char *file_path,float height,nk_font_config *config)

{
  void *in_RDX;
  long in_RSI;
  long in_RDI;
  undefined4 in_XMM0_Da;
  nk_font_config cfg;
  char *memory;
  nk_size size;
  undefined1 auStackY_e8 [16];
  nk_allocator *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  float in_stack_ffffffffffffff34;
  char *in_stack_ffffffffffffff38;
  nk_font_config *in_stack_ffffffffffffff40;
  nk_font_atlas *in_stack_ffffffffffffff48;
  undefined1 local_90 [8];
  char *local_88;
  undefined8 local_80;
  undefined1 local_78;
  undefined4 local_70;
  char *local_38;
  undefined8 local_30;
  void *local_28;
  undefined4 local_1c;
  nk_font *local_8;
  
  if ((in_RDI == 0) || (in_RSI == 0)) {
    local_8 = (nk_font *)0x0;
  }
  else {
    local_28 = in_RDX;
    local_1c = in_XMM0_Da;
    local_38 = nk_file_load(in_stack_ffffffffffffff38,
                            (nk_size *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30)
                            ,in_stack_ffffffffffffff28);
    if (local_38 == (char *)0x0) {
      local_8 = (nk_font *)0x0;
    }
    else {
      if (local_28 == (void *)0x0) {
        nk_font_config(in_stack_ffffffffffffff34);
        memcpy(local_90,auStackY_e8,0x58);
      }
      else {
        memcpy(local_90,local_28,0x58);
      }
      local_88 = local_38;
      local_80 = local_30;
      local_70 = local_1c;
      local_78 = 1;
      local_8 = nk_font_atlas_add(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    }
  }
  return local_8;
}

Assistant:

NK_API struct nk_font*
nk_font_atlas_add_from_file(struct nk_font_atlas *atlas, const char *file_path,
float height, const struct nk_font_config *config)
{
nk_size size;
char *memory;
struct nk_font_config cfg;

NK_ASSERT(atlas);
NK_ASSERT(atlas->temporary.alloc);
NK_ASSERT(atlas->temporary.free);
NK_ASSERT(atlas->permanent.alloc);
NK_ASSERT(atlas->permanent.free);

if (!atlas || !file_path) return 0;
memory = nk_file_load(file_path, &size, &atlas->permanent);
if (!memory) return 0;

cfg = (config) ? *config: nk_font_config(height);
cfg.ttf_blob = memory;
cfg.ttf_size = size;
cfg.size = height;
cfg.ttf_data_owned_by_atlas = 1;
return nk_font_atlas_add(atlas, &cfg);
}